

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O3

void __thiscall
cppcms::crypto::openssl_aes_encryptor::set_iv(openssl_aes_encryptor *this,void *ptr,size_t size)

{
  undefined8 uVar1;
  invalid_argument *this_00;
  string local_40;
  
  if (size == 0x10) {
    uVar1 = *(undefined8 *)((long)ptr + 8);
    *(undefined8 *)this->iv_enc_ = *ptr;
    *(undefined8 *)(this->iv_enc_ + 8) = uVar1;
    uVar1 = *(undefined8 *)((long)ptr + 8);
    *(undefined8 *)this->iv_dec_ = *ptr;
    *(undefined8 *)(this->iv_dec_ + 8) = uVar1;
    this->iv_initialized_ = true;
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"cppcms::crypto::aes: Invalid IV size","");
  booster::invalid_argument::invalid_argument(this_00,&local_40);
  __cxa_throw(this_00,&booster::invalid_argument::typeinfo,
              booster::invalid_argument::~invalid_argument);
}

Assistant:

void set_iv(void const *ptr,size_t size)
		{
			if(size != sizeof(iv_enc_))
				throw booster::invalid_argument("cppcms::crypto::aes: Invalid IV size");
			memcpy(iv_enc_,ptr,size);
			memcpy(iv_dec_,ptr,size);
			iv_initialized_ = true;
		}